

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

uint Aig_RManSemiCanonicize
               (uint *pOut,uint *pIn,int nVars,char *pCanonPerm,Aig_VSig_t *pSigs,int fReturnIn)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint *puVar4;
  int iVar5;
  uint local_84;
  uint uCanonPhase;
  uint *pTemp;
  int Counter;
  int fChange;
  int Temp;
  int i;
  Aig_VSig_t TempSig;
  int fReturnIn_local;
  Aig_VSig_t *pSigs_local;
  char *pCanonPerm_local;
  uint *puStack_18;
  int nVars_local;
  uint *pIn_local;
  uint *pOut_local;
  
  local_84 = 0;
  TempSig.nCofOnes[10] = fReturnIn;
  unique0x100001f7 = pSigs;
  Aig_RManComputeVSigs(pIn,nVars,pSigs,pOut);
  for (fChange = 0; fChange < nVars; fChange = fChange + 1) {
    iVar5 = Aig_RManCompareSigs(stack0xffffffffffffffd0 + (fChange << 1),
                                stack0xffffffffffffffd0 + (fChange * 2 + 1),nVars);
    if (0 < iVar5) {
      local_84 = 1 << ((byte)fChange & 0x1f) | local_84;
      memcpy(&Temp,stack0xffffffffffffffd0 + (fChange << 1),0x34);
      memcpy(stack0xffffffffffffffd0 + (fChange << 1),stack0xffffffffffffffd0 + (fChange * 2 + 1),
             0x34);
      memcpy(stack0xffffffffffffffd0 + (fChange * 2 + 1),&Temp,0x34);
      Kit_TruthChangePhase(pIn,nVars,fChange);
    }
  }
  bVar2 = 0;
  puStack_18 = pIn;
  pIn_local = pOut;
  do {
    bVar3 = false;
    for (fChange = 0; puVar4 = puStack_18, fChange < nVars + -1; fChange = fChange + 1) {
      iVar5 = Aig_RManCompareSigs(stack0xffffffffffffffd0 + (fChange << 1),
                                  stack0xffffffffffffffd0 + (fChange + 1) * 2,nVars);
      if (0 < iVar5) {
        bVar2 = bVar2 + 1;
        bVar3 = true;
        cVar1 = pCanonPerm[fChange];
        pCanonPerm[fChange] = pCanonPerm[fChange + 1];
        pCanonPerm[fChange + 1] = cVar1;
        memcpy(&Temp,stack0xffffffffffffffd0 + (fChange << 1),0x34);
        memcpy(stack0xffffffffffffffd0 + (fChange << 1),stack0xffffffffffffffd0 + (fChange + 1) * 2,
               0x34);
        memcpy(stack0xffffffffffffffd0 + (fChange + 1) * 2,&Temp,0x34);
        memcpy(&Temp,stack0xffffffffffffffd0 + (fChange * 2 + 1),0x34);
        memcpy(stack0xffffffffffffffd0 + (fChange * 2 + 1),
               stack0xffffffffffffffd0 + ((fChange + 1) * 2 + 1),0x34);
        memcpy(stack0xffffffffffffffd0 + ((fChange + 1) * 2 + 1),&Temp,0x34);
        Kit_TruthSwapAdjacentVars(pIn_local,puStack_18,nVars,fChange);
        puStack_18 = pIn_local;
        pIn_local = puVar4;
      }
    }
  } while (bVar3);
  if (TempSig.nCofOnes[10] != (uint)((bVar2 ^ 0xff) & 1)) {
    Kit_TruthCopy(pIn_local,puStack_18,nVars);
  }
  return local_84;
}

Assistant:

unsigned Aig_RManSemiCanonicize( unsigned * pOut, unsigned * pIn, int nVars, char * pCanonPerm, Aig_VSig_t * pSigs, int fReturnIn )
{
    Aig_VSig_t TempSig;
    int i, Temp, fChange, Counter;
    unsigned * pTemp, uCanonPhase = 0;
    // collect signatures 
    Aig_RManComputeVSigs( pIn, nVars, pSigs, pOut );
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
//        if ( pStore[2*i+0] <= pStore[2*i+1] )
        if ( Aig_RManCompareSigs( &pSigs[2*i+0], &pSigs[2*i+1], nVars ) <= 0 )
            continue;
        uCanonPhase |= (1 << i);
        TempSig = pSigs[2*i+0];
        pSigs[2*i+0] = pSigs[2*i+1];
        pSigs[2*i+1] = TempSig;
        Kit_TruthChangePhase( pIn, nVars, i );
    }
    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
//            if ( pStore[2*i] <= pStore[2*(i+1)] )
            if ( Aig_RManCompareSigs( &pSigs[2*i], &pSigs[2*(i+1)], nVars ) <= 0 )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            TempSig = pSigs[2*i];
            pSigs[2*i] = pSigs[2*(i+1)];
            pSigs[2*(i+1)] = TempSig;

            TempSig = pSigs[2*i+1];
            pSigs[2*i+1] = pSigs[2*(i+1)+1];
            pSigs[2*(i+1)+1] = TempSig;

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );

    // swap if it was moved an even number of times
    if ( fReturnIn ^ !(Counter & 1) )
        Kit_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}